

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Writer.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP4Writer::DoPutDeferred
          (BP4Writer *this,Variable<short> *variable,int16_t *data)

{
  int iVar1;
  long in_RDI;
  ScopedTimer __var2191;
  short *in_stack_00000110;
  Variable<short> *in_stack_00000118;
  BP4Writer *in_stack_00000120;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff14;
  allocator local_a1;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  string local_78 [8];
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  LogMode in_stack_ffffffffffffffa0;
  allocator local_51;
  string local_50 [80];
  
  if (DoPutDeferred(adios2::core::Variable<short>&,short_const*)::__var191 == '\0') {
    iVar1 = __cxa_guard_acquire(&DoPutDeferred(adios2::core::Variable<short>&,short_const*)::
                                 __var191);
    if (iVar1 != 0) {
      DoPutDeferred::__var191 = (void *)ps_timer_create_("BP4Writer::Put");
      __cxa_guard_release(&DoPutDeferred(adios2::core::Variable<short>&,short_const*)::__var191);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"Engine",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"BP4Writer",(allocator *)&stack0xffffffffffffff87);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff60,"PutDeferred",&local_a1);
  helper::Comm::Rank((Comm *)0xa38612);
  uVar2 = *(undefined4 *)(in_RDI + 0x940);
  helper::Log(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
              in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,
              in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  PutDeferredCommon<short>(in_stack_00000120,in_stack_00000118,in_stack_00000110);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer
            ((ScopedTimer *)CONCAT44(in_stack_ffffffffffffff14,uVar2));
  return;
}

Assistant:

void BP4Writer::InitParameters()
{
    m_BP4Serializer.Init(m_IO.m_Parameters, "in call to BP4::Open to write");
    m_BP4Serializer.ResizeBuffer(m_BP4Serializer.m_Parameters.InitialBufferSize,
                                 "in call to BP4::Open to write");
    m_WriteToBB = !(m_BP4Serializer.m_Parameters.BurstBufferPath.empty());
    m_DrainBB = m_WriteToBB && m_BP4Serializer.m_Parameters.BurstBufferDrain;
}